

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacBlast.c
# Opt level: O3

Gia_Man_t * Bac_ManExtract(Bac_Man_t *p,int fBuffers,int fVerbose)

{
  Bac_Ntk_t *p_00;
  byte *pbVar1;
  byte bVar2;
  uint uVar3;
  Bac_Ntk_t *pBVar4;
  char *pcVar5;
  Gia_Obj_t *pGVar6;
  bool bVar7;
  int iVar8;
  Gia_Man_t *p_01;
  size_t sVar9;
  char *pcVar10;
  Gia_Obj_t *pGVar11;
  Vec_Int_t *pVVar12;
  int *piVar13;
  Gia_Man_t *pGVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  Bac_Ntk_t *local_60;
  int *local_48;
  
  uVar3 = p->iRoot;
  iVar8 = p->nNtks;
  if (iVar8 < (int)uVar3 || (int)uVar3 < 1) {
    (p->vBuf2LeafNtk).nSize = 0;
    (p->vBuf2LeafObj).nSize = 0;
    (p->vBuf2RootNtk).nSize = 0;
    local_60 = (Bac_Ntk_t *)0x0;
    (p->vBuf2RootObj).nSize = 0;
    iVar19 = 0;
    if (iVar8 < 1) goto LAB_008bc9eb;
  }
  else {
    local_60 = p->pNtks + uVar3;
    (p->vBuf2LeafNtk).nSize = 0;
    (p->vBuf2LeafObj).nSize = 0;
    (p->vBuf2RootNtk).nSize = 0;
    (p->vBuf2RootObj).nSize = 0;
  }
  lVar15 = 1;
  do {
    pBVar4 = p->pNtks;
    p_00 = pBVar4 + lVar15;
    uVar3 = pBVar4[lVar15].vType.nSize;
    if (pBVar4[lVar15].vIndex.nCap < (int)uVar3) {
      piVar13 = (p_00->vIndex).pArray;
      if (piVar13 == (int *)0x0) {
        piVar13 = (int *)malloc((long)(int)uVar3 << 2);
      }
      else {
        piVar13 = (int *)realloc(piVar13,(long)(int)uVar3 << 2);
      }
      (p_00->vIndex).pArray = piVar13;
      if (piVar13 == (int *)0x0) goto LAB_008bcede;
      (p_00->vIndex).nCap = uVar3;
    }
    if (0 < (int)uVar3) {
      memset((p_00->vIndex).pArray,0xff,(ulong)uVar3 * 4);
    }
    (p_00->vIndex).nSize = uVar3;
    if (0 < (p_00->vInputs).nSize) {
      lVar21 = 0;
      do {
        Bac_ObjSetIndex(p_00,(p_00->vInputs).pArray[lVar21],(int)lVar21);
        lVar21 = lVar21 + 1;
      } while (lVar21 < (p_00->vInputs).nSize);
    }
    if (0 < (p_00->vOutputs).nSize) {
      lVar21 = 0;
      do {
        Bac_ObjSetIndex(p_00,(p_00->vOutputs).pArray[lVar21],(int)lVar21);
        lVar21 = lVar21 + 1;
      } while (lVar21 < (p_00->vOutputs).nSize);
    }
    iVar8 = (p_00->vType).nSize;
    if (0 < iVar8) {
      lVar24 = 1;
      lVar21 = 2;
      uVar18 = 0;
      do {
        if (0xffffffbb < ((byte)(p_00->vType).pArray[uVar18] >> 1) - 0x49) {
          if (uVar18 != 0) {
            iVar19 = 0;
            uVar22 = uVar18;
            do {
              iVar8 = (p_00->vType).nSize;
              if (iVar8 < (int)uVar22) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                              ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
              }
              uVar22 = uVar22 - 1;
              if (((p_00->vType).pArray[uVar22 & 0xffffffff] & 0xfeU) != 6) goto LAB_008bc895;
              Bac_ObjSetIndex(p_00,(int)uVar22,iVar19);
              iVar19 = iVar19 + 1;
            } while (uVar22 != 0);
            iVar8 = (p_00->vType).nSize;
          }
LAB_008bc895:
          if (((long)(uVar18 + 1) < (long)iVar8) && (((p_00->vType).pArray[lVar24] & 0xfeU) == 8)) {
            iVar19 = 0;
            lVar23 = lVar21;
            do {
              Bac_ObjSetIndex(p_00,(int)lVar24 + iVar19,iVar19);
              iVar8 = (p_00->vType).nSize;
              if (iVar8 <= (int)lVar23) break;
              iVar19 = iVar19 + 1;
              pbVar1 = (byte *)((p_00->vType).pArray + lVar23);
              lVar23 = lVar23 + 1;
            } while ((*pbVar1 & 0xfe) == 8);
          }
        }
        uVar18 = uVar18 + 1;
        lVar24 = lVar24 + 1;
        lVar21 = lVar21 + 1;
      } while ((long)uVar18 < (long)iVar8);
    }
    iVar8 = (p_00->vType).nCap;
    lVar21 = (long)iVar8;
    if (lVar21 == 0) {
      __assert_fail("Bac_NtkObjNumAlloc(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                    ,0xfe,"void Bac_NtkStartCopies(Bac_Ntk_t *)");
    }
    if ((p_00->vCopy).nCap < iVar8) {
      piVar13 = (p_00->vCopy).pArray;
      if (piVar13 == (int *)0x0) {
        piVar13 = (int *)malloc(lVar21 * 4);
      }
      else {
        piVar13 = (int *)realloc(piVar13,lVar21 * 4);
      }
      (p_00->vCopy).pArray = piVar13;
      if (piVar13 == (int *)0x0) {
LAB_008bcede:
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (p_00->vCopy).nCap = iVar8;
    }
    if (0 < iVar8) {
      memset((p_00->vCopy).pArray,0xff,lVar21 << 2);
    }
    (p_00->vCopy).nSize = iVar8;
    uVar3 = p->nNtks;
    bVar7 = lVar15 < (int)uVar3;
    lVar15 = lVar15 + 1;
  } while (bVar7);
  if ((int)uVar3 < 1) {
    iVar19 = 0;
  }
  else {
    iVar19 = 0;
    lVar15 = 1;
    do {
      iVar8 = p->pNtks[lVar15].vType.nSize;
      iVar20 = 0;
      if (0 < (long)iVar8) {
        lVar21 = 0;
        iVar20 = 0;
        do {
          bVar2 = p->pNtks[lVar15].vType.pArray[lVar21];
          if ((char)bVar2 < '\0') {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x12f,"int Abc_Lit2Var(int)");
          }
          iVar20 = iVar20 + (uint)(bVar2 < 10);
          lVar21 = lVar21 + 1;
        } while (iVar8 != lVar21);
      }
      iVar19 = (iVar19 + iVar8) - iVar20;
      lVar15 = lVar15 + 1;
    } while (lVar15 != (ulong)uVar3 + 1);
  }
LAB_008bc9eb:
  local_48 = &(p->vBuf2LeafNtk).nSize;
  p_01 = Gia_ManStart(iVar19);
  pcVar5 = p->pName;
  if (pcVar5 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar5);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar5);
  }
  p_01->pName = pcVar10;
  pcVar5 = p->pSpec;
  if (pcVar5 == (char *)0x0) {
    pcVar10 = (char *)0x0;
  }
  else {
    sVar9 = strlen(pcVar5);
    pcVar10 = (char *)malloc(sVar9 + 1);
    strcpy(pcVar10,pcVar5);
  }
  p_01->pSpec = pcVar10;
  if (0 < (local_60->vInputs).nSize) {
    lVar15 = 0;
    do {
      uVar3 = (local_60->vInputs).pArray[lVar15];
      pGVar11 = Gia_ManAppendObj(p_01);
      uVar18 = *(ulong *)pGVar11;
      *(ulong *)pGVar11 = uVar18 | 0x9fffffff;
      *(ulong *)pGVar11 =
           uVar18 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_01->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar6 = p_01->pObjs;
      if ((pGVar11 < pGVar6) || (pGVar6 + p_01->nObjs <= pGVar11)) goto LAB_008bce81;
      Vec_IntPush(p_01->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar6) >> 2) * -0x55555555);
      pGVar6 = p_01->pObjs;
      if ((pGVar11 < pGVar6) || (pGVar6 + p_01->nObjs <= pGVar11)) goto LAB_008bce81;
      if (((int)uVar3 < 0) || ((local_60->vCopy).nSize <= (int)uVar3)) goto LAB_008bcea0;
      if ((local_60->vCopy).pArray[uVar3] != -1) {
        __assert_fail("Bac_ObjCopy(p, i) == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                      ,0x12d,"void Bac_ObjSetCopy(Bac_Ntk_t *, int, int)");
      }
      Vec_IntFillExtra(&local_60->vCopy,uVar3 + 1,0);
      if ((local_60->vCopy).nSize <= (int)uVar3) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (local_60->vCopy).pArray[uVar3] =
           (int)((ulong)((long)pGVar11 - (long)pGVar6) >> 2) * 0x55555556;
      lVar15 = lVar15 + 1;
    } while (lVar15 < (local_60->vInputs).nSize);
  }
  Gia_ManHashAlloc(p_01);
  pVVar12 = (Vec_Int_t *)malloc(0x10);
  pVVar12->nCap = 10000;
  pVVar12->nSize = 0;
  piVar13 = (int *)malloc(40000);
  pVVar12->pArray = piVar13;
  p_01->vBarBufs = pVVar12;
  pVVar12 = (Vec_Int_t *)malloc(0x10);
  pVVar12->nCap = 10000;
  piVar13 = (int *)malloc(40000);
  pVVar12->pArray = piVar13;
  pVVar12->nSize = 10000;
  if (piVar13 != (int *)0x0) {
    memset(piVar13,0xff,40000);
  }
  Bac_ManPrepareGates(p);
  if (0 < (local_60->vOutputs).nSize) {
    lVar15 = 0;
    do {
      Bac_ManExtract_rec(p_01,local_60,(local_60->vOutputs).pArray[lVar15],fBuffers,pVVar12);
      lVar15 = lVar15 + 1;
    } while (lVar15 < (local_60->vOutputs).nSize);
  }
  Bac_ManUndoGates(p);
  if (pVVar12->pArray != (int *)0x0) {
    free(pVVar12->pArray);
  }
  free(pVVar12);
  Gia_ManHashStop(p_01);
  if (0 < (local_60->vOutputs).nSize) {
    lVar15 = 0;
    do {
      iVar8 = (local_60->vOutputs).pArray[lVar15];
      if (((long)iVar8 < 0) || ((local_60->vCopy).nSize <= iVar8)) {
LAB_008bcea0:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar3 = (local_60->vCopy).pArray[iVar8];
      if ((int)uVar3 < 0) {
LAB_008bcebf:
        __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
      }
      uVar17 = uVar3 >> 1;
      if (p_01->nObjs <= (int)uVar17) goto LAB_008bcebf;
      if ((~*(uint *)(p_01->pObjs + uVar17) & 0x1fffffff) != 0 &&
          (int)*(uint *)(p_01->pObjs + uVar17) < 0) {
        __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x316,"int Gia_ManAppendCo(Gia_Man_t *, int)");
      }
      pGVar11 = Gia_ManAppendObj(p_01);
      uVar18 = *(ulong *)pGVar11;
      *(ulong *)pGVar11 = uVar18 | 0x80000000;
      pGVar6 = p_01->pObjs;
      if ((pGVar11 < pGVar6) || (pGVar6 + p_01->nObjs <= pGVar11)) {
LAB_008bce81:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar22 = (ulong)(((uint)((int)pGVar11 - (int)pGVar6) >> 2) * -0x55555555 - uVar17 & 0x1fffffff
                      );
      uVar16 = (ulong)((uVar3 & 1) << 0x1d);
      *(ulong *)pGVar11 = uVar16 | uVar18 & 0xffffffffc0000000 | 0x80000000 | uVar22;
      *(ulong *)pGVar11 =
           uVar16 | uVar18 & 0xe0000000c0000000 | 0x80000000 | uVar22 |
           (ulong)(p_01->vCos->nSize & 0x1fffffff) << 0x20;
      pGVar6 = p_01->pObjs;
      if ((pGVar11 < pGVar6) || (pGVar6 + p_01->nObjs <= pGVar11)) goto LAB_008bce81;
      Vec_IntPush(p_01->vCos,(int)((ulong)((long)pGVar11 - (long)pGVar6) >> 2) * -0x55555555);
      if (p_01->pFanData != (int *)0x0) {
        Gia_ObjAddFanout(p_01,pGVar11 + -(ulong)((uint)*(undefined8 *)pGVar11 & 0x1fffffff),pGVar11)
        ;
      }
      if ((pGVar11 < p_01->pObjs) || (p_01->pObjs + p_01->nObjs <= pGVar11)) goto LAB_008bce81;
      lVar15 = lVar15 + 1;
    } while (lVar15 < (local_60->vOutputs).nSize);
  }
  if (*local_48 != p_01->nBufs) {
    __assert_fail("Vec_IntSize(&p->vBuf2LeafNtk) == pNew->nBufs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacBlast.c"
                  ,0x101,"Gia_Man_t *Bac_ManExtract(Bac_Man_t *, int, int)");
  }
  pGVar14 = Gia_ManCleanup(p_01);
  Gia_ManStop(p_01);
  return pGVar14;
}

Assistant:

Gia_Man_t * Bac_ManExtract( Bac_Man_t * p, int fBuffers, int fVerbose )
{
    Bac_Ntk_t * pNtk, * pRoot = Bac_ManRoot(p);
    Gia_Man_t * pNew, * pTemp; 
    Vec_Int_t * vMap = NULL;
    int i, iObj;

    Vec_IntClear( &p->vBuf2LeafNtk );
    Vec_IntClear( &p->vBuf2LeafObj );
    Vec_IntClear( &p->vBuf2RootNtk );
    Vec_IntClear( &p->vBuf2RootObj );

    Bac_ManForEachNtk( p, pNtk, i )
    {
        Bac_NtkDeriveIndex( pNtk );
        Bac_NtkStartCopies( pNtk );
    }

    // start the manager
    pNew = Gia_ManStart( Bac_ManNodeNum(p) );
    pNew->pName = Abc_UtilStrsav(p->pName);
    pNew->pSpec = Abc_UtilStrsav(p->pSpec);

    // primary inputs
    Bac_NtkForEachPi( pRoot, iObj, i )
        Bac_ObjSetCopy( pRoot, iObj, Gia_ManAppendCi(pNew) );

    // internal nodes
    Gia_ManHashAlloc( pNew );
    pNew->vBarBufs = Vec_IntAlloc( 10000 );
    vMap = Vec_IntStartFull( 10000 );
    Bac_ManPrepareGates( p );
    Bac_NtkForEachPo( pRoot, iObj, i )
        Bac_ManExtract_rec( pNew, pRoot, iObj, fBuffers, vMap );
    Bac_ManUndoGates( p );
    Vec_IntFreeP( &vMap );
    Gia_ManHashStop( pNew );

    // primary outputs
    Bac_NtkForEachPo( pRoot, iObj, i )
        Gia_ManAppendCo( pNew, Bac_ObjCopy(pRoot, iObj) );
    assert( Vec_IntSize(&p->vBuf2LeafNtk) == pNew->nBufs );

    // cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    //Gia_ManPrintStats( pNew, NULL );
    return pNew;
}